

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InlinePass::InlineSingleInstruction
          (InlinePass *this,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *callee2caller,BasicBlock *new_blk_ptr,Instruction *inst,uint32_t dbg_inlined_at)

{
  bool bVar1;
  Op OVar2;
  IRContext *c;
  Instruction *__p;
  pointer pIVar3;
  pointer pvVar4;
  DecorationManager *this_00;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_90;
  uint32_t local_88;
  undefined4 local_84;
  uint32_t nid;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_78;
  const_iterator mapItr;
  anon_class_8_1_75b9271f aStack_68;
  uint32_t rid;
  function<void_(unsigned_int_*)> local_60;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_40;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> cp_inst;
  uint32_t dbg_inlined_at_local;
  Instruction *inst_local;
  BasicBlock *new_blk_ptr_local;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *callee2caller_local;
  InlinePass *this_local;
  
  cp_inst._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = dbg_inlined_at;
  OVar2 = Instruction::opcode(inst);
  if ((OVar2 == OpReturnValue) || (OVar2 = Instruction::opcode(inst), OVar2 == OpReturn)) {
    return true;
  }
  c = Pass::context(&this->super_Pass);
  __p = Instruction::Clone(inst,c);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_40,__p);
  pIVar3 = std::
           unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ::operator->(&local_40);
  aStack_68.callee2caller = callee2caller;
  std::function<void(unsigned_int*)>::
  function<spvtools::opt::InlinePass::InlineSingleInstruction(std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>const&,spvtools::opt::BasicBlock*,spvtools::opt::Instruction_const*,unsigned_int)::__0,void>
            ((function<void(unsigned_int*)> *)&local_60,&stack0xffffffffffffff98);
  Instruction::ForEachInId(pIVar3,&local_60);
  std::function<void_(unsigned_int_*)>::~function(&local_60);
  pIVar3 = std::
           unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ::operator->(&local_40);
  mapItr.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur._4_4_
       = Instruction::result_id(pIVar3);
  if (mapItr.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur.
      _4_4_ != 0) {
    local_78._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::find(callee2caller,
                (key_type *)
                ((long)&mapItr.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                        ._M_cur + 4));
    _nid = (__node_type *)
           std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::end(callee2caller);
    bVar1 = std::__detail::operator==
                      (&local_78,
                       (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> *)
                       &nid);
    if (bVar1) {
      this_local._7_1_ = false;
      goto LAB_003a05e4;
    }
    pvVar4 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
             operator->((_Node_const_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                         *)&local_78);
    local_88 = pvVar4->second;
    pIVar3 = std::
             unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ::operator->(&local_40);
    Instruction::SetResultId(pIVar3,local_88);
    this_00 = Pass::get_decoration_mgr(&this->super_Pass);
    analysis::DecorationManager::CloneDecorations
              (this_00,mapItr.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                       ._M_cur._4_4_,local_88);
  }
  pIVar3 = std::
           unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ::operator->(&local_40);
  Instruction::UpdateDebugInlinedAt
            (pIVar3,cp_inst._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  unique_ptr(&local_90,&local_40);
  BasicBlock::AddInstruction(new_blk_ptr,&local_90);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_90);
  this_local._7_1_ = true;
LAB_003a05e4:
  local_84 = 1;
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_40);
  return this_local._7_1_;
}

Assistant:

bool InlinePass::InlineSingleInstruction(
    const std::unordered_map<uint32_t, uint32_t>& callee2caller,
    BasicBlock* new_blk_ptr, const Instruction* inst, uint32_t dbg_inlined_at) {
  // If we have return, it must be at the end of the callee. We will handle
  // it at the end.
  if (inst->opcode() == spv::Op::OpReturnValue ||
      inst->opcode() == spv::Op::OpReturn)
    return true;

  // Copy callee instruction and remap all input Ids.
  std::unique_ptr<Instruction> cp_inst(inst->Clone(context()));
  cp_inst->ForEachInId([&callee2caller](uint32_t* iid) {
    const auto mapItr = callee2caller.find(*iid);
    if (mapItr != callee2caller.end()) {
      *iid = mapItr->second;
    }
  });

  // If result id is non-zero, remap it.
  const uint32_t rid = cp_inst->result_id();
  if (rid != 0) {
    const auto mapItr = callee2caller.find(rid);
    if (mapItr == callee2caller.end()) {
      return false;
    }
    uint32_t nid = mapItr->second;
    cp_inst->SetResultId(nid);
    get_decoration_mgr()->CloneDecorations(rid, nid);
  }

  cp_inst->UpdateDebugInlinedAt(dbg_inlined_at);
  new_blk_ptr->AddInstruction(std::move(cp_inst));
  return true;
}